

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Transform * pbrt::RotateX(Transform *__return_storage_ptr__,Float theta)

{
  ulong uVar1;
  Float (*paFVar2) [4];
  undefined1 (*pauVar3) [16];
  int i;
  long lVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [16];
  SquareMatrix<4> r;
  undefined1 local_48 [16];
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  fVar9 = sinf(theta * 0.017453292);
  fVar10 = cosf(theta * 0.017453292);
  auVar11._4_4_ = extraout_XMM0_Db;
  auVar11._0_4_ = fVar9;
  auVar11._8_4_ = extraout_XMM0_Dc;
  auVar11._12_4_ = extraout_XMM0_Dd;
  lVar4 = 0;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(auVar11,auVar6);
  auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  pauVar3 = &local_48;
  do {
    auVar7 = vpbroadcastq_avx512vl();
    lVar4 = lVar4 + 1;
    uVar1 = vpcmpeqq_avx512vl(auVar7,auVar8);
    auVar11 = vpmovm2d_avx512vl(uVar1 & 0xf);
    auVar11 = vpsrld_avx(auVar11,0x1f);
    auVar11 = vcvtdq2ps_avx(auVar11);
    *pauVar3 = auVar11;
    pauVar3 = pauVar3 + 1;
  } while (lVar4 != 4);
  puVar5 = (undefined8 *)0x0;
  auVar8 = vpbroadcastq_avx512vl();
  auVar8 = vpaddq_avx2(auVar8,_DAT_004a9b80);
  pauVar3 = &local_48;
  do {
    auVar7 = vpbroadcastq_avx512vl();
    puVar5 = (undefined8 *)((long)puVar5 + 1);
    auVar7 = vpsllq_avx2(auVar7,2);
    vpaddq_avx2(auVar8,auVar7);
    auVar11 = vgatherqps_avx512vl(*puVar5);
    *pauVar3 = auVar11;
    pauVar3 = pauVar3 + 1;
  } while (puVar5 != (undefined8 *)0x4);
  *(Float *)((long)((__return_storage_ptr__->m).m + 0) + 0) = 1.0;
  *(Float *)((long)((__return_storage_ptr__->m).m + 0) + 4) = 0.0;
  *(Float *)((long)((__return_storage_ptr__->m).m + 0) + 8) = 0.0;
  *(Float *)((long)((__return_storage_ptr__->m).m + 0) + 0xc) = 0.0;
  *(ulong *)(__return_storage_ptr__->m).m[1] = (ulong)(uint)fVar10 << 0x20;
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = (ulong)auVar6._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[2] = (ulong)(uint)fVar9 << 0x20;
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = (ulong)(uint)fVar10;
  *(Float *)((long)((__return_storage_ptr__->m).m + 3) + 0) = 0.0;
  *(Float *)((long)((__return_storage_ptr__->m).m + 3) + 4) = 0.0;
  paFVar2 = (__return_storage_ptr__->m).m;
  *(Float *)((long)(paFVar2 + 3) + 8) = 0.0;
  *(Float *)((long)(paFVar2 + 3) + 0xc) = 1.0;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_48._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_48._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = uStack_38;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = uStack_30;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = uStack_28;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = uStack_20;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = uStack_18;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = uStack_10;
  return __return_storage_ptr__;
}

Assistant:

Transform RotateX(Float theta) {
    Float sinTheta = std::sin(Radians(theta));
    Float cosTheta = std::cos(Radians(theta));
    SquareMatrix<4> m(1,        0,         0, 0,
                      0, cosTheta, -sinTheta, 0,
                      0, sinTheta,  cosTheta, 0,
                      0,        0,         0, 1);
    return Transform(m, Transpose(m));
}